

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

char * google::protobuf::compiler::java::GetCapitalizedType(FieldDescriptor *field,bool immutable)

{
  Type TVar1;
  char *pcVar2;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  TVar1 = FieldDescriptor::type(field);
  if (TVar1 - TYPE_DOUBLE < 0x12) {
    pcVar2 = &DAT_003466a4 + *(int *)(&DAT_003466a4 + (ulong)(TVar1 - TYPE_DOUBLE) * 4);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x29f);
    other = internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

FieldDescriptor::Type GetType(const FieldDescriptor* field) {
  return field->type();
}